

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilation_context.cpp
# Opt level: O0

void __thiscall
CompilationContext::offsetToLineAndCol(CompilationContext *this,int offset,int *line,int *col)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  int *in_RCX;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  int in_ESI;
  long in_RDI;
  int i;
  int start;
  int local_28;
  
  piVar1 = (int *)CONCAT71(in_register_00000011,in_DL);
  *piVar1 = 1;
  *in_RCX = 1;
  pcVar4 = (char *)std::__cxx11::string::c_str();
  bVar2 = is_utf8_bom(pcVar4,0);
  local_28 = 0;
  if (bVar2) {
    local_28 = 3;
  }
  for (; (iVar3 = std::__cxx11::string::length(), local_28 < iVar3 && (local_28 <= in_ESI + -1));
      local_28 = local_28 + 1) {
    *in_RCX = *in_RCX + 1;
    pcVar4 = (char *)std::__cxx11::string::operator[](in_RDI + 0xa0);
    if ((*pcVar4 == '\r') &&
       (pcVar4 = (char *)std::__cxx11::string::operator[](in_RDI + 0xa0), *pcVar4 == '\n')) {
      local_28 = local_28 + 1;
    }
    pcVar4 = (char *)std::__cxx11::string::operator[](in_RDI + 0xa0);
    if ((*pcVar4 == '\r') ||
       (pcVar4 = (char *)std::__cxx11::string::operator[](in_RDI + 0xa0), *pcVar4 == '\n')) {
      *piVar1 = *piVar1 + 1;
      *in_RCX = 1;
    }
  }
  return;
}

Assistant:

void CompilationContext::offsetToLineAndCol(int offset, int & line, int & col) const
{
  line = 1;
  col = 1;
  int start = is_utf8_bom(code.c_str(), 0) ? 3 : 0;

  for (int i = start; i < int(code.length()); i++)
  {
    if (offset - 1 < i)
      break;

    col++;

    if (code[i] == 0x0d && code[i + 1] == 0x0a)
      i++;

    if (code[i] == 0x0d || code[i] == 0x0a)
    {
      line++;
      col = 1;
    }
  }
}